

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O0

AMQP_VALUE on_message_received(void *context,MESSAGE_HANDLE message)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  LOGGER_LOG p_Var5;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  AMQP_MANAGEMENT_EXECUTE_OPERATION_RESULT execute_operation_result;
  LOGGER_LOG l_10;
  OPERATION_MESSAGE_INSTANCE *operation_message;
  _Bool is_error;
  LIST_ITEM_HANDLE pLStack_d8;
  _Bool found;
  LIST_ITEM_HANDLE list_item_handle;
  char *status_description;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG p_Stack_b0;
  int32_t status_code;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  uint64_t correlation_id;
  AMQP_VALUE correlation_id_value;
  AMQP_VALUE map;
  AMQP_VALUE desc_value;
  AMQP_VALUE desc_key;
  AMQP_VALUE value;
  AMQP_VALUE key;
  LOGGER_LOG l_2;
  PROPERTIES_HANDLE response_properties;
  LOGGER_LOG l_1;
  AMQP_VALUE application_properties;
  AMQP_MANAGEMENT_HANDLE amqp_management;
  LOGGER_LOG l;
  AMQP_VALUE result;
  MESSAGE_HANDLE message_local;
  void *context_local;
  
  result = (AMQP_VALUE)message;
  message_local = (MESSAGE_HANDLE)context;
  if (context == (void *)0x0) {
    amqp_management = (AMQP_MANAGEMENT_HANDLE)xlogging_get_log_function();
    if (amqp_management != (AMQP_MANAGEMENT_HANDLE)0x0) {
      (*(code *)amqp_management)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                 ,"on_message_received",0x49,1,"NULL context in on_message_received");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    application_properties = (AMQP_VALUE)context;
    iVar3 = message_get_application_properties(message,(AMQP_VALUE *)&l_1);
    if (iVar3 == 0) {
      iVar3 = message_get_properties((MESSAGE_HANDLE)result,(PROPERTIES_HANDLE *)&l_2);
      if (iVar3 == 0) {
        iVar3 = properties_get_correlation_id((PROPERTIES_HANDLE)l_2,(AMQP_VALUE *)&correlation_id);
        if (iVar3 == 0) {
          iVar3 = amqpvalue_get_ulong((AMQP_VALUE)correlation_id,(uint64_t *)&l_3);
          if (iVar3 == 0) {
            correlation_id_value = amqpvalue_get_inplace_described_value((AMQP_VALUE)l_1);
            if (correlation_id_value == (AMQP_VALUE)0x0) {
              l_6 = xlogging_get_log_function();
              if (l_6 != (LOGGER_LOG)0x0) {
                (*l_6)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                       ,"on_message_received",0x8c,1,"Could not retrieve application property map");
              }
              (**(code **)((long)&application_properties[2].value + 8))
                        (*(undefined8 *)(application_properties + 3));
              l = (LOGGER_LOG)
                  messaging_delivery_rejected
                            ("amqp:internal-error",
                             "Could not get application property map from the application properties in the AMQP management response."
                            );
            }
            else {
              value = amqpvalue_create_string
                                ((char *)application_properties[3].value.described_value.value);
              if (value == (AMQP_VALUE)0x0) {
                l_7 = xlogging_get_log_function();
                if (l_7 != (LOGGER_LOG)0x0) {
                  (*l_7)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                         ,"on_message_received",0x99,1,"Could not create status-code amqp value");
                }
                (**(code **)((long)&application_properties[2].value + 8))
                          (*(undefined8 *)(application_properties + 3));
                l = (LOGGER_LOG)messaging_delivery_released();
              }
              else {
                desc_key = amqpvalue_get_map_value(correlation_id_value,value);
                if (desc_key == (AMQP_VALUE)0x0) {
                  p_Stack_b0 = xlogging_get_log_function();
                  if (p_Stack_b0 != (LOGGER_LOG)0x0) {
                    (*p_Stack_b0)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                  ,"on_message_received",0xa5,1,
                                  "Could not retrieve status code from application properties");
                  }
                  (**(code **)((long)&application_properties[2].value + 8))
                            (*(undefined8 *)(application_properties + 3));
                  l = (LOGGER_LOG)
                      messaging_delivery_rejected
                                ("amqp:internal-error",
                                 "Could not retrieve status code from the application properties in the AMQP management response."
                                );
                }
                else {
                  iVar3 = amqpvalue_get_int(desc_key,(int32_t *)((long)&l_8 + 4));
                  if (iVar3 == 0) {
                    desc_value = amqpvalue_create_string(*(char **)(application_properties + 4));
                    if (desc_value == (AMQP_VALUE)0x0) {
                      status_description = (char *)xlogging_get_log_function();
                      if ((LOGGER_LOG)status_description != (LOGGER_LOG)0x0) {
                        (*(code *)status_description)
                                  (AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                   ,"on_message_received",0xbe,1,
                                   "Could not create status-description amqp value");
                      }
                      (**(code **)((long)&application_properties[2].value + 8))
                                (*(undefined8 *)(application_properties + 3));
                      l = (LOGGER_LOG)messaging_delivery_released();
                    }
                    else {
                      list_item_handle = (LIST_ITEM_HANDLE)0x0;
                      bVar2 = false;
                      bVar1 = false;
                      map = amqpvalue_get_map_value(correlation_id_value,desc_value);
                      if (map == (AMQP_VALUE)0x0) {
                        list_item_handle = (LIST_ITEM_HANDLE)0x0;
                      }
                      else {
                        iVar3 = amqpvalue_get_string(map,(char **)&list_item_handle);
                        if (iVar3 != 0) {
                          list_item_handle = (LIST_ITEM_HANDLE)0x0;
                        }
                      }
                      for (pLStack_d8 = singlylinkedlist_get_head_item
                                                  ((SINGLYLINKEDLIST_HANDLE)
                                                   application_properties[1].value.described_value.
                                                   descriptor); pLStack_d8 != (LIST_ITEM_HANDLE)0x0;
                          pLStack_d8 = singlylinkedlist_get_next_item(pLStack_d8)) {
                        plVar4 = (long *)singlylinkedlist_item_get_value(pLStack_d8);
                        if (plVar4 == (long *)0x0) {
                          p_Var5 = xlogging_get_log_function();
                          if (p_Var5 != (LOGGER_LOG)0x0) {
                            (*p_Var5)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                      ,"on_message_received",0xe3,1,
                                      "Could not create status-description amqp value");
                          }
                          (**(code **)((long)&application_properties[2].value + 8))();
                          messaging_delivery_released();
                          break;
                        }
                        if (l_3 == (LOGGER_LOG)plVar4[2]) {
                          if ((*(byte *)(plVar4 + 3) & 1) == 0) {
                            p_Var5 = xlogging_get_log_function();
                            if (p_Var5 != (LOGGER_LOG)0x0) {
                              (*p_Var5)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                        ,"on_message_received",0xf4,1,
                                        "Did not receive send confirmation for pending operation");
                            }
                            l_11._4_4_ = 3;
                            iVar3 = async_operation_cancel((ASYNC_OPERATION_HANDLE)plVar4[5]);
                            if (iVar3 != 0) {
                              p_Var5 = xlogging_get_log_function();
                              if (p_Var5 != (LOGGER_LOG)0x0) {
                                (*p_Var5)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                          ,"on_message_received",0xf9,1,
                                          "Failed cancelling pending send operation");
                              }
                              bVar1 = true;
                            }
                          }
                          else if ((l_8._4_4_ < 200) || (299 < l_8._4_4_)) {
                            l_11._4_4_ = 3;
                          }
                          else {
                            l_11._4_4_ = 1;
                          }
                          if (*plVar4 != 0) {
                            (*(code *)*plVar4)(plVar4[1],l_11._4_4_,l_8._4_4_,list_item_handle,
                                               result);
                          }
                          async_operation_destroy((ASYNC_OPERATION_HANDLE)plVar4[6]);
                          iVar3 = singlylinkedlist_remove
                                            ((SINGLYLINKEDLIST_HANDLE)
                                             application_properties[1].value.described_value.
                                             descriptor,pLStack_d8);
                          if (iVar3 == 0) {
                            bVar2 = true;
                          }
                          else {
                            p_Var5 = xlogging_get_log_function();
                            if (p_Var5 != (LOGGER_LOG)0x0) {
                              (*p_Var5)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                        ,"on_message_received",0x117,1,
                                        "Cannot remove pending operation");
                            }
                            bVar1 = true;
                          }
                          break;
                        }
                      }
                      if (bVar1) {
                        (**(code **)((long)&application_properties[2].value + 8))
                                  (*(undefined8 *)(application_properties + 3));
                        l = (LOGGER_LOG)messaging_delivery_released();
                      }
                      else if (bVar2) {
                        l = (LOGGER_LOG)messaging_delivery_accepted();
                      }
                      else {
                        p_Var5 = xlogging_get_log_function();
                        if (p_Var5 != (LOGGER_LOG)0x0) {
                          (*p_Var5)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                    ,"on_message_received",0x134,1,
                                    "Could not match AMQP management response to request");
                        }
                        (**(code **)((long)&application_properties[2].value + 8))
                                  (*(undefined8 *)(application_properties + 3));
                        l = (LOGGER_LOG)
                            messaging_delivery_rejected
                                      ("amqp:internal-error",
                                       "Could not match AMQP management response to request");
                      }
                      if (map != (AMQP_VALUE)0x0) {
                        amqpvalue_destroy(map);
                      }
                      amqpvalue_destroy(desc_value);
                    }
                  }
                  else {
                    l_9 = xlogging_get_log_function();
                    if (l_9 != (LOGGER_LOG)0x0) {
                      (*l_9)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                             ,"on_message_received",0xb1,1,
                             "Could not retrieve status code int value");
                    }
                    (**(code **)((long)&application_properties[2].value + 8))
                              (*(undefined8 *)(application_properties + 3));
                    l = (LOGGER_LOG)
                        messaging_delivery_rejected
                                  ("amqp:internal-error",
                                   "Could not retrieve status code value from the application properties in the AMQP management response."
                                  );
                  }
                  amqpvalue_destroy(desc_key);
                }
                amqpvalue_destroy(value);
              }
            }
          }
          else {
            l_5 = xlogging_get_log_function();
            if (l_5 != (LOGGER_LOG)0x0) {
              (*l_5)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                     ,"on_message_received",0x7f,1,"Could not retrieve correlation Id ulong value");
            }
            (**(code **)((long)&application_properties[2].value + 8))
                      (*(undefined8 *)(application_properties + 3));
            l = (LOGGER_LOG)
                messaging_delivery_rejected
                          ("amqp:internal-error",
                           "Could not get correlation Id from AMQP management response.");
          }
        }
        else {
          l_4 = xlogging_get_log_function();
          if (l_4 != (LOGGER_LOG)0x0) {
            (*l_4)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                   ,"on_message_received",0x75,1,"Could not retrieve correlation Id");
          }
          (**(code **)((long)&application_properties[2].value + 8))
                    (*(undefined8 *)(application_properties + 3));
          l = (LOGGER_LOG)
              messaging_delivery_rejected
                        ("amqp:internal-error",
                         "Could not get correlation Id from AMQP management response.");
        }
        properties_destroy((PROPERTIES_HANDLE)l_2);
      }
      else {
        key = (AMQP_VALUE)xlogging_get_log_function();
        if (key != (AMQP_VALUE)0x0) {
          (*(code *)key)(0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                         ,"on_message_received",0x62,1,"Could not retrieve message properties");
        }
        (**(code **)((long)&application_properties[2].value + 8))
                  (*(undefined8 *)(application_properties + 3));
        l = (LOGGER_LOG)
            messaging_delivery_rejected
                      ("amqp:internal-error",
                       "Could not get message properties on AMQP management response.");
      }
      amqpvalue_destroy((AMQP_VALUE)l_1);
    }
    else {
      response_properties = (PROPERTIES_HANDLE)xlogging_get_log_function();
      if (response_properties != (PROPERTIES_HANDLE)0x0) {
        (*(code *)response_properties)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                   ,"on_message_received",0x55,1,"Could not retrieve application properties");
      }
      (**(code **)((long)&application_properties[2].value + 8))
                (*(undefined8 *)(application_properties + 3));
      l = (LOGGER_LOG)
          messaging_delivery_rejected
                    ("amqp:internal-error",
                     "Could not get application properties on AMQP management response.");
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

static AMQP_VALUE on_message_received(const void* context, MESSAGE_HANDLE message)
{
    PROPERTIES_HANDLE properties;
    /* VS believes this is not initialized, so have to set it to the worse case here */
    AMQP_VALUE result = NULL;
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    MESSAGE_OUTCOME message_outcome;

    if (message == NULL)
    {
        LogError("NULL message");
        message_outcome = MESSAGE_OUTCOME_RELEASED;
    }
    else
    {
        if (message_get_properties(message, &properties) != 0)
        {
            LogError("Cannot retrieve message properties");
            message_outcome = MESSAGE_OUTCOME_REJECTED;
            result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve message properties");
        }
        else
        {
            AMQP_VALUE correlation_id;

            if (properties_get_correlation_id(properties, &correlation_id) != 0)
            {
                LogError("Cannot retrieve correlation id");
                message_outcome = MESSAGE_OUTCOME_REJECTED;
                result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve correlation id");
            }
            else
            {
                IOTHUBTRANSPORT_AMQP_METHOD* method_handle = (IOTHUBTRANSPORT_AMQP_METHOD*)malloc(sizeof(IOTHUBTRANSPORT_AMQP_METHOD));
                if (method_handle == NULL)
                {
                    LogError("Cannot allocate method handle");
                    message_outcome = MESSAGE_OUTCOME_RELEASED;
                }
                else
                {
                    IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
                    size_t realloc_size = safe_multiply_size_t(safe_add_size_t(amqp_methods_handle->method_request_handle_count, 1), sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
                    if (realloc_size == SIZE_MAX || 
                        (new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) == NULL)
                    {
                        free(method_handle);
                        LogError("Cannot grow method handles array, size:%zu", realloc_size);
                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                    }
                    else
                    {
                        amqp_methods_handle->method_request_handles = new_handles;

                        if (amqpvalue_get_uuid(correlation_id, &method_handle->correlation_id) != 0)
                        {
                            free(method_handle);
                            LogError("Cannot get uuid value for correlation-id");
                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                            result = messaging_delivery_rejected("amqp:decode-error", "Cannot get uuid value for correlation-id");
                        }
                        else
                        {
                            BINARY_DATA binary_data;

                            if (message_get_body_amqp_data_in_place(message, 0, &binary_data) != 0)
                            {
                                free(method_handle);
                                LogError("Cannot get method request message payload");
                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot get method request message payload");
                            }
                            else
                            {
                                AMQP_VALUE application_properties;

                                if (message_get_application_properties(message, &application_properties) != 0)
                                {
                                    LogError("Cannot get application properties");
                                    free(method_handle);
                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot get application properties");
                                }
                                else
                                {
                                    AMQP_VALUE amqp_properties_map = amqpvalue_get_inplace_described_value(application_properties);
                                    if (amqp_properties_map == NULL)
                                    {
                                        LogError("Cannot get application properties map");
                                        free(method_handle);
                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                    }
                                    else
                                    {
                                        AMQP_VALUE property_key = amqpvalue_create_string("IoThub-methodname");
                                        if (property_key == NULL)
                                        {
                                            LogError("Cannot create the property key for method name");
                                            free(method_handle);
                                            message_outcome = MESSAGE_OUTCOME_RELEASED;
                                        }
                                        else
                                        {
                                            AMQP_VALUE property_value = amqpvalue_get_map_value(amqp_properties_map, property_key);
                                            if (property_value == NULL)
                                            {
                                                LogError("Cannot find the IoThub-methodname property in the properties map");
                                                free(method_handle);
                                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot find the IoThub-methodname property in the properties map");
                                            }
                                            else
                                            {
                                                const char* method_name;

                                                if (amqpvalue_get_string(property_value, &method_name) != 0)
                                                {
                                                    LogError("Cannot read the method name from the property value");
                                                    free(method_handle);
                                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot read the method name from the property value");
                                                }
                                                else
                                                {
                                                    result = messaging_delivery_accepted();
                                                    if (result == NULL)
                                                    {
                                                        LogError("Cannot allocate memory for delivery state");
                                                        free(method_handle);
                                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                                    }
                                                    else
                                                    {
                                                        method_handle->iothubtransport_amqp_methods_handle = amqp_methods_handle;

                                                        /* set the method request handle in the handle array */
                                                        amqp_methods_handle->method_request_handles[amqp_methods_handle->method_request_handle_count] = method_handle;
                                                        amqp_methods_handle->method_request_handle_count++;

                                                        if (amqp_methods_handle->on_method_request_received(amqp_methods_handle->on_method_request_received_context, method_name, binary_data.bytes, binary_data.length, method_handle) != 0)
                                                        {
                                                            LogError("Cannot execute the callback with the given data");
                                                            amqpvalue_destroy(result);
                                                            free(method_handle);
                                                            amqp_methods_handle->method_request_handle_count--;
                                                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                            result = messaging_delivery_rejected("amqp:internal-error", "Cannot execute the callback with the given data");
                                                        }
                                                        else
                                                        {
                                                            message_outcome = MESSAGE_OUTCOME_ACCEPTED;
                                                        }
                                                    }
                                                }

                                                amqpvalue_destroy(property_value);
                                            }

                                            amqpvalue_destroy(property_key);
                                        }
                                    }

                                    application_properties_destroy(application_properties);
                                }
                            }
                        }
                    }
                }
            }

            properties_destroy(properties);
        }
    }

    switch (message_outcome)
    {
    default:
        break;

    case MESSAGE_OUTCOME_RELEASED:
        result = messaging_delivery_released();

        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
        break;

    case MESSAGE_OUTCOME_REJECTED:
    case MESSAGE_OUTCOME_ACCEPTED:
        /* all is well */
        break;
    }

    return result;
}